

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::clearBasis(SoPlexBase<double> *this)

{
  Status SVar1;
  EVP_PKEY_CTX *in_RSI;
  
  SPxSolverBase<double>::reLoad(&this->_solver);
  SVar1 = SPxSolverBase<double>::status(&this->_solver);
  this->_status = SVar1;
  this->_hasBasis = false;
  if ((this->_rationalLUSolver).super_CLUFactorRational.stat == UNLOADED) {
    return;
  }
  SLUFactorRational::init(&this->_rationalLUSolver,in_RSI);
  return;
}

Assistant:

void SoPlexBase<R>::clearBasis()
{
   _solver.reLoad();
   _status = _solver.status();
   _hasBasis = false;
   _rationalLUSolver.clear();
}